

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.hpp
# Opt level: O0

mutable_buffers_type __thiscall
io::net::dynamic_vector_buffer<unsigned_char,_std::allocator<unsigned_char>_>::prepare
          (dynamic_vector_buffer<unsigned_char,_std::allocator<unsigned_char>_> *this,size_t n)

{
  length_error *this_00;
  mutable_buffer mVar1;
  mutable_buffers_type mVar2;
  mutable_buffer local_58;
  mutable_buffer local_48 [2];
  size_t local_28;
  size_t n_local;
  dynamic_vector_buffer<unsigned_char,_std::allocator<unsigned_char>_> *this_local;
  
  local_28 = n;
  n_local = (size_t)this;
  if (this->max_size_ < this->size_ + n) {
    this_00 = (length_error *)__cxa_allocate_exception(0x10);
    std::length_error::length_error
              (this_00,"dynamic_vector_buffer::prepare(): size() + n > max_size()");
    __cxa_throw(this_00,&std::length_error::typeinfo,std::length_error::~length_error);
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(this->vec_,this->size_ + n);
  local_58 = buffer<unsigned_char,std::allocator<unsigned_char>>(this->vec_);
  local_48[0] = operator+(&local_58,this->size_);
  mVar1 = buffer(local_48,local_28);
  mVar2.data_ = mVar1.data_;
  mVar2.size_ = mVar1.size_;
  return mVar2;
}

Assistant:

mutable_buffers_type prepare(std::size_t n)
    {
        if (size_ + n > max_size_) {
            throw std::length_error{"dynamic_vector_buffer::prepare(): size() + n > max_size()"};
        }

        vec_.resize(size_ + n);
        return buffer(buffer(vec_) + size_, n);
    }